

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrLDA0xb1(CPU *this)

{
  Memory *this_00;
  uint8_t uVar1;
  uint16_t addr;
  byte bVar2;
  
  this_00 = this->m;
  addr = indirect_indexed_addr_j(this);
  uVar1 = Memory::Read8(this_00,addr);
  this->A = uVar1;
  if (uVar1 == '\0') {
    bVar2 = this->field_0x2e | 0x40;
  }
  else {
    bVar2 = this->field_0x2e & 0xbf;
    if ((char)uVar1 < '\0') {
      bVar2 = bVar2 | 1;
      goto LAB_0010eadb;
    }
  }
  bVar2 = bVar2 & 0xfe;
LAB_0010eadb:
  this->field_0x2e = bVar2;
  return 5;
}

Assistant:

int CPU::instrLDA0xb1() {
	LDA(indirect_indexed_addr());
	return 5;
}